

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_filter.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::StructFilter::ToExpression(StructFilter *this,Expression *column)

{
  LogicalType *args;
  long value;
  BoundConstantExpression *this_00;
  pointer pTVar1;
  type pBVar2;
  long *in_RDX;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  arguments;
  templated_unique_single_t child;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1b0;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_1a8;
  Value local_190;
  ScalarFunction local_150;
  
  args = StructType::GetChildType
                   ((LogicalType *)(in_RDX + 7),
                    (idx_t)(column->super_BaseExpression).alias._M_dataplus._M_p);
  local_1a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*in_RDX + 0x88))(&local_150);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&local_1a8,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_150);
  if (local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function !=
      (_func_int **)0x0) {
    (**(code **)(*local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function.
                  _vptr_Function + 8))();
  }
  value = NumericCastImpl<long,_unsigned_long,_false>::Convert
                    ((unsigned_long)((column->super_BaseExpression).alias._M_dataplus._M_p + 1));
  Value::BIGINT(&local_190,value);
  this_00 = (BoundConstantExpression *)operator_new(0x98);
  Value::Value((Value *)&local_150,&local_190);
  BoundConstantExpression::BoundConstantExpression(this_00,(Value *)&local_150);
  Value::~Value((Value *)&local_150);
  local_1b0._M_head_impl = (Expression *)this_00;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
              *)&local_1a8,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_1b0);
  if ((BoundConstantExpression *)local_1b0._M_head_impl != (BoundConstantExpression *)0x0) {
    (*(((Expression *)&(local_1b0._M_head_impl)->super_BaseExpression)->super_BaseExpression).
      _vptr_BaseExpression[1])();
  }
  local_1b0._M_head_impl = (Expression *)0x0;
  Value::~Value(&local_190);
  GetExtractAtFunction();
  StructExtractAtFun::GetBindData
            ((StructExtractAtFun *)&local_1b0,
             (idx_t)(column->super_BaseExpression).alias._M_dataplus._M_p);
  make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType_const&,duckdb::ScalarFunction,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>>
            ((duckdb *)&local_190,args,&local_150,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_1a8,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             &local_1b0);
  if (local_1b0._M_head_impl != (Expression *)0x0) {
    (*((local_1b0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_02476950;
  if (local_150.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_150.function.super__Function_base._M_manager)
              ((_Any_data *)&local_150.function,(_Any_data *)&local_150.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_150.super_BaseScalarFunction);
  pTVar1 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
           operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                       *)&column->return_type);
  pBVar2 = unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
           ::operator*((unique_ptr<duckdb::BoundFunctionExpression,_std::default_delete<duckdb::BoundFunctionExpression>,_true>
                        *)&local_190);
  (*pTVar1->_vptr_TableFilter[6])(this,pTVar1,pBVar2);
  if ((long *)local_190.type_._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_190.type_._0_8_ + 8))();
  }
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_1a8);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> StructFilter::ToExpression(const Expression &column) const {
	auto &child_type = StructType::GetChildType(column.return_type, child_idx);
	vector<unique_ptr<Expression>> arguments;
	arguments.push_back(column.Copy());
	arguments.push_back(make_uniq<BoundConstantExpression>(Value::BIGINT(NumericCast<int64_t>(child_idx + 1))));
	auto child = make_uniq<BoundFunctionExpression>(child_type, GetExtractAtFunction(), std::move(arguments),
	                                                StructExtractAtFun::GetBindData(child_idx));
	return child_filter->ToExpression(*child);
}